

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_sah.cpp
# Opt level: O2

Builder * embree::avx::BVH8Quad4iSceneBuilderSAH(void *bvh,Scene *scene,size_t mode)

{
  BVHNBuilderSAH<8,_embree::QuadMi<4>_> *this;
  
  this = (BVHNBuilderSAH<8,_embree::QuadMi<4>_> *)::operator_new(0xa8);
  BVHNBuilderSAH<8,_embree::QuadMi<4>_>::BVHNBuilderSAH
            (this,(BVH *)bvh,scene,4,1.0,4,0xffffffffffffffff,MTY_QUAD_MESH,true);
  return &this->super_Builder;
}

Assistant:

Builder* BVH8Quad4iSceneBuilderSAH     (void* bvh, Scene* scene, size_t mode) { return new BVHNBuilderSAH<8,Quad4i>((BVH8*)bvh,scene,4,1.0f,4,inf,QuadMesh::geom_type,true); }